

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttributeTranslator.cpp
# Opt level: O1

void __thiscall
arangodb::velocypack::AttributeTranslator::add
          (AttributeTranslator *this,string_view key,uint64_t id)

{
  _Head_base<0UL,_arangodb::velocypack::Builder_*,_false> this_00;
  Builder *this_01;
  pointer __p;
  Value local_40;
  
  if ((this->_builder)._M_t.
      super___uniq_ptr_impl<arangodb::velocypack::Builder,_std::default_delete<arangodb::velocypack::Builder>_>
      ._M_t.
      super__Tuple_impl<0UL,_arangodb::velocypack::Builder_*,_std::default_delete<arangodb::velocypack::Builder>_>
      .super__Head_base<0UL,_arangodb::velocypack::Builder_*,_false>._M_head_impl == (Builder *)0x0)
  {
    this_01 = (Builder *)operator_new(0xb8);
    Builder::Builder(this_01);
    local_40._valueType = None;
    local_40._1_3_ = 0;
    local_40._cType = None;
    std::
    __uniq_ptr_impl<arangodb::velocypack::Builder,_std::default_delete<arangodb::velocypack::Builder>_>
    ::reset((__uniq_ptr_impl<arangodb::velocypack::Builder,_std::default_delete<arangodb::velocypack::Builder>_>
             *)this,this_01);
    std::
    unique_ptr<arangodb::velocypack::Builder,_std::default_delete<arangodb::velocypack::Builder>_>::
    ~unique_ptr((unique_ptr<arangodb::velocypack::Builder,_std::default_delete<arangodb::velocypack::Builder>_>
                 *)&local_40);
    this_00._M_head_impl =
         (this->_builder)._M_t.
         super___uniq_ptr_impl<arangodb::velocypack::Builder,_std::default_delete<arangodb::velocypack::Builder>_>
         ._M_t.
         super__Tuple_impl<0UL,_arangodb::velocypack::Builder_*,_std::default_delete<arangodb::velocypack::Builder>_>
         .super__Head_base<0UL,_arangodb::velocypack::Builder_*,_false>._M_head_impl;
    Value::Value(&local_40,Object,false);
    Builder::addInternal<arangodb::velocypack::Value>(this_00._M_head_impl,&local_40);
  }
  local_40._valueType = UInt;
  local_40._cType = UInt64;
  local_40._value.u = id;
  Builder::addInternal<arangodb::velocypack::Value>
            ((this->_builder)._M_t.
             super___uniq_ptr_impl<arangodb::velocypack::Builder,_std::default_delete<arangodb::velocypack::Builder>_>
             ._M_t.
             super__Tuple_impl<0UL,_arangodb::velocypack::Builder_*,_std::default_delete<arangodb::velocypack::Builder>_>
             .super__Head_base<0UL,_arangodb::velocypack::Builder_*,_false>._M_head_impl,key,
             &local_40);
  this->_count = this->_count + 1;
  return;
}

Assistant:

void AttributeTranslator::add(std::string_view key, uint64_t id) {
  if (_builder == nullptr) {
    _builder = std::make_unique<Builder>();
    _builder->add(Value(ValueType::Object));
  }

  _builder->add(key, Value(id));
  _count++;
}